

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(void *this)

{
  StrWriter *pSVar1;
  char *str;
  
  str = ".w";
  if (**(int **)((long)this + 0x30) - 1U < 3) {
    str = "w";
  }
  pSVar1 = operator<<((StrWriter *)this,str);
  return pSVar1;
}

Assistant:

StrWriter&
StrWriter::operator<<(Sz<S>)
{
    switch (style.syntax) {

        case Syntax::MOIRA_MIT:
       case Syntax::GNU:
        case Syntax::GNU_MIT:

            *this << ((S == Byte) ? "b" : (S == Word) ? "w" : "l");
            break;

        default:

            *this << ((S == Byte) ? ".b" : (S == Word) ? ".w" : ".l");
    }

    return *this;
}